

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O0

target_ulong cpu_get_psr_sparc64(CPUSPARCState_conflict2 *env)

{
  CPUSPARCState_conflict2 *env_local;
  
  helper_compute_psr_sparc64(env);
  return (ulong)(env->psr & 0xf00000);
}

Assistant:

target_ulong cpu_get_psr(CPUSPARCState *env)
{
    helper_compute_psr(env);

#if !defined(TARGET_SPARC64)
    return env->version | (env->psr & PSR_ICC) |
        (env->psref ? PSR_EF : 0) |
        (env->psrpil << 8) |
        (env->psrs ? PSR_S : 0) |
        (env->psrps ? PSR_PS : 0) |
        (env->psret ? PSR_ET : 0) | env->cwp;
#else
    return env->psr & PSR_ICC;
#endif
}